

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnStructType
          (BinaryReaderObjdump *this,Index index,Index field_count,TypeMut *fields)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  string local_50;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    printf(" - type[%u] (struct",CONCAT44(in_register_00000034,index));
    if (field_count != 0) {
      uVar1 = (ulong)field_count;
      do {
        if (fields->mutable_ == true) {
          printf(" (mut");
        }
        Type::GetName_abi_cxx11_(&local_50,&fields->type);
        printf(" %s",local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (fields->mutable_ == true) {
          putchar(0x29);
        }
        fields = fields + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    puts(")");
  }
  return (Result)Ok;
}

Assistant:

bool BinaryReaderObjdump::ShouldPrintDetails() {
  if (options_->mode != ObjdumpMode::Details) {
    return false;
  }
  return print_details_;
}